

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::resize(Value *this,ArrayIndex newSize)

{
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  ArrayIndex AVar1;
  bool bVar2;
  CZString local_58;
  ArrayIndex local_44;
  ArrayIndex local_40;
  ArrayIndex index;
  ArrayIndex oldSize;
  Value local_30;
  ArrayIndex local_14;
  Value *pVStack_10;
  ArrayIndex newSize_local;
  Value *this_local;
  
  bVar2 = true;
  if ((*(ushort *)&this->field_0x8 & 0xff) != 0) {
    bVar2 = (*(ushort *)&this->field_0x8 & 0xff) == 6;
  }
  local_14 = newSize;
  pVStack_10 = this;
  if (!bVar2) {
    __assert_fail("type_ == nullValue || type_ == arrayValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/jsoncpp/src/lib_json/json_value.cpp"
                  ,0x41b,"void Json::Value::resize(ArrayIndex)");
  }
  if ((*(ushort *)&this->field_0x8 & 0xff) == 0) {
    Value(&local_30,arrayValue);
    operator=(this,&local_30);
    ~Value(&local_30);
  }
  local_40 = size(this);
  if (local_14 == 0) {
    clear(this);
  }
  else if (local_40 < local_14) {
    operator[](this,local_14 - 1);
  }
  else {
    for (local_44 = local_14; local_44 < local_40; local_44 = local_44 + 1) {
      this_00 = (this->value_).map_;
      CZString::CZString(&local_58,local_44);
      std::
      map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
      ::erase(this_00,&local_58);
      CZString::~CZString(&local_58);
    }
    AVar1 = size(this);
    if (AVar1 != local_14) {
      __assert_fail("size() == newSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/jsoncpp/src/lib_json/json_value.cpp"
                    ,0x42a,"void Json::Value::resize(ArrayIndex)");
    }
  }
  return;
}

Assistant:

void 
Value::resize( ArrayIndex newSize )
{
   JSON_ASSERT( type_ == nullValue  ||  type_ == arrayValue );
   if ( type_ == nullValue )
      *this = Value( arrayValue );
#ifndef JSON_VALUE_USE_INTERNAL_MAP
   ArrayIndex oldSize = size();
   if ( newSize == 0 )
      clear();
   else if ( newSize > oldSize )
      (*this)[ newSize - 1 ];
   else
   {
      for ( ArrayIndex index = newSize; index < oldSize; ++index )
      {
         value_.map_->erase( index );
      }
      assert( size() == newSize );
   }
#else
   value_.array_->resize( newSize );
#endif
}